

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O3

art_ref_t art_node16_insert(art_t *art,art_node16_t *node,art_ref_t child,uint8_t key)

{
  uint8_t *puVar1;
  byte *pbVar2;
  byte bVar3;
  art_node_t *paVar4;
  art_node_t *paVar5;
  uint64_t uVar6;
  art_ref_t aVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  uVar9 = (ulong)(node->field_0).field_0.count;
  if (0xf < uVar9) {
    bVar3 = (node->field_0).field_0.base.prefix_size;
    uVar6 = art_allocate_index(art,'\x04');
    paVar4 = art->nodes[4];
    lVar8 = uVar6 * 0x290;
    pbVar2 = (byte *)((long)paVar4 + lVar8);
    *pbVar2 = bVar3;
    memcpy(pbVar2 + 1,(void *)((long)&node->field_0 + 1),(ulong)bVar3);
    pbVar2[6] = 0;
    pbVar2[8] = 0xff;
    pbVar2[9] = 0xff;
    pbVar2[10] = 0xff;
    pbVar2[0xb] = 0xff;
    pbVar2[0xc] = 0xff;
    pbVar2[0xd] = 0xff;
    pbVar2[0xe] = 0;
    pbVar2[0xf] = 0;
    memset((void *)((long)paVar4 + lVar8 + 0x10),0x30,0x100);
    lVar12 = 7;
    do {
      art_node48_insert(art,(art_node48_t *)((long)paVar4 + lVar8),
                        *(art_ref_t *)((long)node + lVar12 * 8 + -0x20),
                        *(uint8_t *)((long)&node->field_0 + lVar12));
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x17);
    paVar5 = art->nodes[3];
    (node->field_0).next_free = art->first_free[3];
    art->first_free[3] = ((long)node - (long)paVar5 >> 3) * -0x79435e50d79435e5;
    aVar7 = art_node48_insert(art,(art_node48_t *)((long)paVar4 + lVar8),child,key);
    return aVar7;
  }
  uVar10 = 0;
  uVar11 = uVar10;
  if (uVar9 != 0) {
    do {
      uVar11 = uVar10;
      if (key < *(byte *)((long)&node->field_0 + uVar10 + 7)) break;
      uVar10 = uVar10 + 1;
      uVar11 = uVar9;
    } while (uVar9 != uVar10);
  }
  memmove((void *)((long)&node->field_0 + uVar11 + 8),(void *)((long)&node->field_0 + uVar11 + 7),
          uVar9 - uVar11);
  memmove((void *)((long)&node->field_0 + uVar11 * 8 + 0x20),
          (void *)((long)&node->field_0 + uVar11 * 8 + 0x18),(uVar9 - uVar11) * 8);
  *(art_ref_t *)((long)&node->field_0 + uVar11 * 8 + 0x18) = child;
  *(uint8_t *)((long)&node->field_0 + uVar11 + 7) = key;
  puVar1 = &(node->field_0).field_0.count;
  *puVar1 = *puVar1 + '\x01';
  return ((ulong)((long)node - (long)art->nodes[3]) >> 3) * -0x5e50d79435e50000 | 3;
}

Assistant:

static art_ref_t art_node16_insert(art_t *art, art_node16_t *node,
                                   art_ref_t child, uint8_t key) {
    if (node->count < 16) {
        size_t idx = 0;
        for (; idx < node->count; ++idx) {
            if (node->keys[idx] > key) {
                break;
            }
        }
        size_t after = node->count - idx;
        // Shift other keys to maintain sorted order.
        memmove(node->keys + idx + 1, node->keys + idx,
                after * sizeof(art_key_chunk_t));
        memmove(node->children + idx + 1, node->children + idx,
                after * sizeof(art_ref_t));

        node->children[idx] = child;
        node->keys[idx] = key;
        node->count++;
        return art_get_ref(art, (art_node_t *)node, CROARING_ART_NODE16_TYPE);
    }
    art_node48_t *new_node =
        art_node48_create(art, node->base.prefix, node->base.prefix_size);
    for (size_t i = 0; i < 16; ++i) {
        art_node48_insert(art, new_node, node->children[i], node->keys[i]);
    }
    art_node_free(art, (art_node_t *)node, CROARING_ART_NODE16_TYPE);
    return art_node48_insert(art, new_node, child, key);
}